

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

QLayoutItem * __thiscall QtMWidgets::ToolBarLayout::itemAt(ToolBarLayout *this,int index)

{
  long lVar1;
  ulong uVar2;
  QWidgetItem **ppQVar3;
  
  if (-1 < index) {
    uVar2 = (ulong)(uint)index;
    lVar1 = (this->buttons).d.size;
    if ((long)uVar2 < lVar1 + 2) {
      if (index == 0) {
        ppQVar3 = &this->left;
      }
      else if (lVar1 + 1U == uVar2) {
        ppQVar3 = &this->right;
      }
      else {
        ppQVar3 = (QWidgetItem **)((this->buttons).d.ptr + (uVar2 - 1));
      }
      return (QLayoutItem *)*ppQVar3;
    }
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *
ToolBarLayout::itemAt( int index ) const
{
	if( index >= 0 && index < buttons.size() + 2 )
	{
		if( index == 0 )
			return left;
		else if( index == buttons.size() + 1 )
			return right;
		else
			return buttons.at( index - 1 );
	}
	else
		return 0;
}